

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objindx(mcmcxdef *mctx,objnum objn)

{
  uchar *puVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  mcmcxdef *pmVar8;
  uint16_t tmp;
  uint uVar9;
  mcmcxdef *pmVar10;
  byte *pbVar11;
  undefined6 in_register_00000032;
  uint uVar12;
  mcmcxdef *pmVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *unaff_R15;
  byte *__src;
  bool bVar18;
  ushort need;
  ushort local_5a;
  ulong local_58;
  ulong local_50;
  mcmcxdef *local_48;
  uchar *local_40;
  ulong local_38;
  
  puVar5 = mcmlck(mctx,objn);
  uVar3 = *(ushort *)(puVar5 + 6);
  uVar16 = (ulong)uVar3;
  local_50 = (CONCAT62(in_register_00000032,objn) & 0xffffffff) >> 8;
  local_58 = (ulong)((uint)CONCAT62(in_register_00000032,objn) & 0xff);
  uVar4 = *(ushort *)(puVar5 + 8);
  uVar6 = (uint)*(ushort *)
                 ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[local_50][local_58] >> 8]->mcmosiz +
                 (ulong)((mctx->mcmcxmtb[local_50][local_58] & 0xff) << 5)) - (uint)uVar4;
  local_48 = mctx;
  if (uVar6 < (uint)uVar3 * 4 + 2) {
    local_5a = (uVar3 * 4 - (short)uVar6) + 0x2a;
    puVar5 = objexp(mctx,objn,&local_5a);
    puVar1 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2;
    uVar4 = *(ushort *)(puVar5 + 8);
  }
  else {
    puVar1 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2;
  }
  pbVar11 = puVar1 + 0xe;
  pbVar17 = puVar5 + uVar4;
  iVar14 = 0;
  uVar6 = 0;
  local_40 = puVar5;
  do {
    iVar15 = (int)uVar16;
    uVar16 = (ulong)(iVar15 - 1);
    if (iVar15 == 0) {
      puVar5[2] = puVar5[2] | 2;
      puVar2 = &local_48->mcmcxgl->mcmcxtab[local_48->mcmcxmtb[local_50][local_58] >> 8]
                [(byte)local_48->mcmcxmtb[local_50][local_58]].mcmoflg;
      *puVar2 = *puVar2 | 1;
      mcmunlck(local_48,objn);
      return;
    }
    __src = pbVar17;
    if (uVar6 != 0) {
      pmVar8 = (mcmcxdef *)(ulong)(uVar6 - 1);
      pmVar13 = (mcmcxdef *)0x0;
      while( true ) {
        uVar7 = (uint)pmVar8;
        uVar12 = (uint)pmVar13;
        pmVar10 = mctx;
        __src = unaff_R15;
        if (uVar7 < uVar12) break;
        uVar9 = (uVar7 - uVar12 >> 1) + uVar12;
        mctx = (mcmcxdef *)(ulong)uVar9;
        unaff_R15 = pbVar17 + uVar9 * 4;
        bVar18 = pbVar17[uVar9 * 4] < *pbVar11;
        if ((pbVar17[uVar9 * 4] == *pbVar11) &&
           (bVar18 = unaff_R15[1] < pbVar11[1], pmVar10 = mctx, __src = unaff_R15,
           unaff_R15[1] == pbVar11[1])) break;
        if (bVar18) {
          pmVar13 = (mcmcxdef *)(ulong)(uVar12 + 1);
          if (1 < uVar7 - uVar12) {
            pmVar13 = mctx;
          }
        }
        else {
          pmVar8 = (mcmcxdef *)(ulong)(uVar7 - 1);
          if (uVar9 != uVar7) {
            pmVar8 = mctx;
          }
        }
      }
      mctx = (mcmcxdef *)(ulong)uVar6;
      if (uVar6 < (uint)pmVar10) {
        mctx = (mcmcxdef *)((ulong)pmVar10 & 0xffffffff);
      }
      uVar7 = iVar14 + (uint)pmVar10 * -4;
      for (; (uint)pmVar10 < uVar6; pmVar10 = (mcmcxdef *)(ulong)((uint)pmVar10 + 1)) {
        if (*pbVar11 < *__src) {
          local_38 = uVar16;
          memmove(__src + 4,__src,(ulong)uVar7);
          puVar5 = local_40;
          mctx = pmVar10;
          uVar16 = local_38;
          break;
        }
        __src = __src + 4;
        uVar7 = uVar7 - 4;
      }
    }
    *__src = *pbVar11;
    __src[1] = pbVar11[1];
    *(short *)(__src + 2) = (short)pbVar11 - (short)puVar5;
    pbVar11 = pbVar11 + (ulong)*(ushort *)(pbVar11 + 3) + 6;
    uVar6 = uVar6 + 1;
    iVar14 = iVar14 + 4;
    unaff_R15 = __src;
  } while( true );
}

Assistant:

void objindx(mcmcxdef *mctx, objnum objn)
{
    uint    newsiz;
    uint    avail;
    objdef *objptr;
    uint    cnt;
    prpdef *p;
    uchar  *indp;
    uchar  *indbase;
    uint    icnt;
    uint    first;
    uint    last;
    uint    cur;
    
    objptr = (objdef *)mcmlck(mctx, objn);            /* get object pointer */
    cnt = objnprop(objptr);                     /* get number of properties */
    p = objprp(objptr);         /* get pointer to properties (or old index) */
    newsiz = 2 + 4*cnt;                 /* figure size needed for the index */
    
    avail = mcmobjsiz(mctx, objn) - objfree(objptr);
    
    /* insert space for the index; expand the object if necessary */
    if (avail < newsiz)
    {
        ushort  need;
        
        newsiz += 10*4;                   /* add some extra space for later */
        need = newsiz - avail;            /* compute amount of space needed */
        objptr = objexp(mctx, objn, &need);
        p = objprp(objptr);
    }
    
    /* now build the index */
    indbase = objpfre(objptr);
    for (icnt = 0 ; cnt ; p = objpnxt(p), --cnt, ++icnt)
    {
        uint ofs = (uchar *)p - (uchar *)objptr;
        
        if (icnt)
        {
            /* figure out where to insert this property */
            first = 0;
            last = icnt - 1;
            for (;;)
            {
                if (first > last) break;
                cur = first + (last - first)/2;
                indp = indbase + cur*4;
                if (indp[0] == p[0] && indp[1] == p[1])
                    break;
                else if (indp[0] < p[0]
                         || (indp[0] == p[0] && indp[1] < p[1]))
                    first = (cur == first ? first + 1 : cur);
                else
                    last = (cur == last ? last - 1 : cur);
            }
            
            /* make sure we're positioned just before insertion point */
            while (cur < icnt
                   && (indp[0] <= p[0]
                       || (indp[0] == p[0] && indp[1] <= p[1])))
            {
                indp += 4;
                ++cur;
            }
                
            /* move elements above if any */
            if (cur < icnt)
                memmove(indp + 4, indp, (size_t)((icnt - cur) * 4));
        }
        else
            indp = indbase;
        
        /* insert property into index */
        indp[0] = p[0];
        indp[1] = p[1];
        oswp2(indp+2, ofs);
    }
    
    /* set the index flag, and dirty and free the object */
    objsflg(objptr, objflg(objptr) | OBJFINDEX);
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
}